

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelIdentifier.cpp
# Opt level: O1

ostream * csm::MIC::operator<<(ostream *os,RangeList *rangeList)

{
  long lVar1;
  Range *range;
  ulong index;
  
  lVar1 = (long)(rangeList->theRanges).
                super__Vector_base<csm::MIC::RangeList::Range,_std::allocator<csm::MIC::RangeList::Range>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(rangeList->theRanges).
                super__Vector_base<csm::MIC::RangeList::Range,_std::allocator<csm::MIC::RangeList::Range>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar1 != 0) {
    lVar1 = (lVar1 >> 4) * -0x3333333333333333;
    index = 0;
    do {
      range = RangeList::range(rangeList,index);
      operator<<(os,range);
      if (index < lVar1 - 1U) {
        std::__ostream_insert<char,std::char_traits<char>>(os," , ",3);
      }
      index = index + 1;
    } while (lVar1 + (ulong)(lVar1 == 0) != index);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os,const RangeList& rangeList)
{
   const size_t NUM_RANGES = rangeList.size();
   
   for (size_t i = 0; i < NUM_RANGES; ++i)
   {
      os << rangeList.range(i);
      
      if (i < (NUM_RANGES -1)) os << " , ";
   }
   
   return os;
}